

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strdup2.c
# Opt level: O2

char * upb_strdup2(char *s,size_t len,upb_Arena *a)

{
  char *__dest;
  ulong size;
  
  if (len != 0xffffffffffffffff) {
    size = (len & 0xfffffffffffffff8) + 8;
    __dest = a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)__dest) < size) {
      __dest = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
    }
    else {
      if ((char *)((ulong)(__dest + 7) & 0xfffffffffffffff8) != __dest) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = __dest + size;
    }
    if (__dest != (char *)0x0) {
      if (len != 0) {
        memcpy(__dest,s,len);
      }
      __dest[len] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char* upb_strdup2(const char* s, size_t len, upb_Arena* a) {
  size_t n;
  char* p;

  // Prevent overflow errors.
  if (len == SIZE_MAX) return NULL;

  // Always null-terminate, even if binary data; but don't rely on the input to
  // have a null-terminating byte since it may be a raw binary buffer.
  n = len + 1;
  p = upb_Arena_Malloc(a, n);
  if (p) {
    if (len != 0) memcpy(p, s, len);
    p[len] = 0;
  }
  return p;
}